

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_atomics_notify(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv)

{
  JSValue val;
  JSValue obj;
  list_head *plVar1;
  int iVar2;
  list_head *pres;
  int *in_RDX;
  JSClassID *in_RSI;
  long in_R8;
  JSValue JVar3;
  JSValue in_stack_00000000;
  int in_stack_00000010;
  JSArrayBuffer *abuf;
  JSAtomicsWaiter *waiter;
  void *ptr;
  int32_t n;
  int32_t count;
  list_head waiter_list;
  list_head *el1;
  list_head *el;
  list_head *head;
  list_head *el_00;
  long local_98;
  undefined8 in_stack_ffffffffffffff70;
  list_head *el_01;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  JSValueUnion in_stack_ffffffffffffff88;
  list_head *in_stack_ffffffffffffff90;
  list_head *local_68;
  int in_stack_ffffffffffffffa0;
  long lVar5;
  undefined1 in_stack_ffffffffffffffd0 [16];
  JSValue JVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int64_t in_stack_ffffffffffffffe8;
  undefined4 uStack_c;
  
  head = *(list_head **)(in_R8 + 0x10);
  el_00 = *(list_head **)(in_R8 + 0x18);
  obj.u._4_4_ = in_stack_ffffffffffffffe4;
  obj.u.int32 = in_stack_ffffffffffffffe0;
  obj.tag = in_stack_ffffffffffffffe8;
  pres = (list_head *)
         js_atomics_get_ptr(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,in_RDX,
                            in_RSI,obj,in_stack_00000000,in_stack_00000010);
  lVar5 = in_stack_ffffffffffffffd0._4_8_;
  if (pres == (list_head *)0x0) {
    JVar3.u.ptr = (void *)(lVar5 << 0x20);
    JVar3.tag = 6;
  }
  else {
    iVar2 = JS_IsUndefined(*(JSValue *)(in_R8 + 0x20));
    if (iVar2 == 0) {
      head = (list_head *)((ulong)head & 0xffffffff00000000);
      val.tag = (int64_t)in_stack_ffffffffffffff90;
      val.u.float64 = in_stack_ffffffffffffff88.float64;
      iVar2 = JS_ToInt32Clamp((JSContext *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (int *)pres,val,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffffa0);
      if (iVar2 != 0) {
        JVar4.u.ptr = (void *)(lVar5 << 0x20);
        JVar4.tag = 6;
        return JVar4;
      }
    }
    else {
      in_stack_ffffffffffffff84 = 0x7fffffff;
    }
    if (*(char *)(local_98 + 4) == '\0') {
      iVar2 = 0;
      if ((*(char *)(local_98 + 5) != '\0') && (0 < in_stack_ffffffffffffff84)) {
        pthread_mutex_lock((pthread_mutex_t *)&js_atomics_mutex);
        init_list_head((list_head *)&stack0xffffffffffffff88);
        plVar1 = (js_atomics_waiter_list.next)->next;
        el_01 = js_atomics_waiter_list.next;
        while (local_68 = plVar1, el_01 != &js_atomics_waiter_list) {
          if (el_01[4].next == pres) {
            list_del(el_01);
            *(undefined4 *)&el_01[1].prev = 0;
            list_add_tail(el_00,head);
            iVar2 = iVar2 + 1;
            if (in_stack_ffffffffffffff84 <= iVar2) break;
          }
          plVar1 = local_68->next;
          el_01 = local_68;
        }
        for (; in_stack_ffffffffffffff90 != (list_head *)&stack0xffffffffffffff88;
            in_stack_ffffffffffffff90 = in_stack_ffffffffffffff90->next) {
          pthread_cond_signal((pthread_cond_t *)&in_stack_ffffffffffffff90[1].next);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&js_atomics_mutex);
      }
      JVar3.u._4_4_ = uStack_c;
      JVar3.u.int32 = iVar2;
      JVar3.tag = 0;
    }
    else {
      JVar3 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1bf491);
    }
  }
  return JVar3;
}

Assistant:

static JSValue js_atomics_notify(JSContext *ctx,
                                 JSValueConst this_obj,
                                 int argc, JSValueConst *argv)
{
    struct list_head *el, *el1, waiter_list;
    int32_t count, n;
    void *ptr;
    JSAtomicsWaiter *waiter;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, NULL, NULL, argv[0], argv[1], 1);
    if (!ptr)
        return JS_EXCEPTION;

    if (JS_IsUndefined(argv[2])) {
        count = INT32_MAX;
    } else {
        if (JS_ToInt32Clamp(ctx, &count, argv[2], 0, INT32_MAX, 0))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);

    n = 0;
    if (abuf->shared && count > 0) {
        pthread_mutex_lock(&js_atomics_mutex);
        init_list_head(&waiter_list);
        list_for_each_safe(el, el1, &js_atomics_waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            if (waiter->ptr == ptr) {
                list_del(&waiter->link);
                waiter->linked = FALSE;
                list_add_tail(&waiter->link, &waiter_list);
                n++;
                if (n >= count)
                    break;
            }
        }
        list_for_each(el, &waiter_list) {
            waiter = list_entry(el, JSAtomicsWaiter, link);
            pthread_cond_signal(&waiter->cond);
        }
        pthread_mutex_unlock(&js_atomics_mutex);
    }
    return JS_NewInt32(ctx, n);
}